

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::verify
          (FilterCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  _Link_type p_Var1;
  byte bVar2;
  uint uVar3;
  GLenum severity;
  int iVar4;
  _Link_type this_00;
  uint *puVar5;
  uint *puVar6;
  _Rb_tree_node_base *p_Var7;
  int extraout_EAX;
  mapped_type *pmVar8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var9;
  _Base_ptr p_Var10;
  undefined1 __x [8];
  _Self __tmp;
  long lVar11;
  ulong uVar12;
  long lVar13;
  VerificationResult result;
  map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
  counts;
  undefined1 in_stack_fffffffffffffd78;
  undefined1 local_260 [16];
  undefined1 local_250 [24];
  _Alloc_hider local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  ResultCollector *local_218;
  uint local_20c;
  string local_208;
  _Rb_tree_node_base *local_1e8;
  undefined1 local_1e0 [8];
  undefined1 local_1d8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [4];
  ios_base local_168 [264];
  map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
  local_60;
  
  this_00 = (_Link_type)
            ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
            m_testCtx)->m_log;
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_t._M_impl.super__Rb_tree_header._M_header;
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_260._0_8_ = local_260 + 0x10;
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"verification","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Verifying","");
  tcu::LogSection::LogSection((LogSection *)local_1e0,(string *)local_260,&local_208);
  __x = local_1e0;
  tcu::TestLog::startSection((TestLog *)this_00,(char *)local_1e0,local_1c0[0]._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0[0]._M_p != local_1b0) {
    __x = (undefined1  [8])(local_1b0[0]._M_allocated_capacity + 1);
    operator_delete(local_1c0[0]._M_p,(ulong)__x);
  }
  if (local_1e0 != (undefined1  [8])(local_1d8 + 8)) {
    __x = (undefined1  [8])(local_1d0._M_allocated_capacity + 1);
    operator_delete((void *)local_1e0,(ulong)__x);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    __x = (undefined1  [8])(local_208.field_2._M_allocated_capacity + 1);
    operator_delete(local_208._M_dataplus._M_p,(ulong)__x);
  }
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    __x = (undefined1  [8])(local_250._0_8_ + 1);
    operator_delete((void *)local_260._0_8_,(ulong)__x);
  }
  lVar11 = *(long *)ctx;
  if (*(long *)(ctx + 8) != lVar11) {
    local_218 = &(this->super_BaseCase).m_results;
    lVar13 = 0;
    uVar12 = 0;
    do {
      p_Var1 = (_Link_type)(lVar11 + lVar13);
      __x = (undefined1  [8])p_Var1;
      pmVar8 = std::
               map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
               ::operator[](&local_60,(key_type *)p_Var1);
      if ((pmVar8->severity != 0) && (pmVar8->severity != *(GLenum *)(lVar11 + 0xc + lVar13))) {
        local_1e0 = (undefined1  [8])this_00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"A message has variable severity between instances: (",0x34)
        ;
        anon_unknown_1::operator<<((ostream *)local_1d8,(MessageID *)p_Var1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,") with severity ",0x10);
        local_260._8_4_ = pmVar8->severity;
        local_260._0_8_ = glu::getDebugMessageSeverityName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_260,(ostream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8," and ",5);
        local_208._M_string_length._0_4_ = *(undefined4 *)(lVar11 + 0xc + lVar13);
        local_208._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_208,(ostream *)local_1d8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        local_1e0 = (undefined1  [8])(local_1d8 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,
                   "Message severity changed between instances of the same message","");
        __x = (undefined1  [8])&DAT_00000001;
        tcu::ResultCollector::addResult(local_218,QP_TEST_RESULT_FAIL,(string *)local_1e0);
        if (local_1e0 != (undefined1  [8])(local_1d8 + 8)) {
          __x = (undefined1  [8])(local_1d0._M_allocated_capacity + 1);
          operator_delete((void *)local_1e0,(ulong)__x);
        }
      }
      pmVar8->refCount = pmVar8->refCount + 1;
      pmVar8->severity = *(GLenum *)(lVar11 + 0xc + lVar13);
      uVar12 = uVar12 + 1;
      lVar11 = *(long *)ctx;
      lVar13 = lVar13 + 0x30;
    } while (uVar12 < (ulong)((*(long *)(ctx + 8) - lVar11 >> 4) * -0x5555555555555555));
  }
  lVar11 = *(long *)sig;
  if (*(long *)(sig + 8) != lVar11) {
    lVar13 = 0;
    uVar12 = 0;
    do {
      p_Var1 = (_Link_type)(lVar11 + lVar13);
      __x = (undefined1  [8])p_Var1;
      pmVar8 = std::
               map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
               ::operator[](&local_60,(key_type *)p_Var1);
      if ((pmVar8->severity != 0) && (pmVar8->severity != *(GLenum *)(lVar11 + 0xc + lVar13))) {
        local_1e0 = (undefined1  [8])this_00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"A message has variable severity between instances: (",0x34)
        ;
        anon_unknown_1::operator<<((ostream *)local_1d8,(MessageID *)p_Var1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,") with severity ",0x10);
        local_260._8_4_ = pmVar8->severity;
        local_260._0_8_ = glu::getDebugMessageSeverityName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_260,(ostream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8," and ",5);
        local_208._M_string_length._0_4_ = *(undefined4 *)(lVar11 + 0xc + lVar13);
        local_208._M_dataplus._M_p = (pointer)glu::getDebugMessageSeverityName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_208,(ostream *)local_1d8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        local_1e0 = (undefined1  [8])(local_1d8 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,
                   "Message severity changed between instances of the same message","");
        __x = (undefined1  [8])&DAT_00000001;
        tcu::ResultCollector::addResult
                  (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,(string *)local_1e0);
        if (local_1e0 != (undefined1  [8])(local_1d8 + 8)) {
          __x = (undefined1  [8])(local_1d0._M_allocated_capacity + 1);
          operator_delete((void *)local_1e0,(ulong)__x);
        }
      }
      pmVar8->resCount = pmVar8->resCount + 1;
      pmVar8->severity = *(GLenum *)(lVar11 + 0xc + lVar13);
      uVar12 = uVar12 + 1;
      lVar11 = *(long *)sig;
      lVar13 = lVar13 + 0x30;
    } while (uVar12 < (ulong)((*(long *)(sig + 8) - lVar11 >> 4) * -0x5555555555555555));
  }
  if ((_Rb_tree_header *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_t._M_impl.super__Rb_tree_header) {
    p_Var10 = local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_260._0_8_ = local_260 + 0x10;
      uVar3 = *(uint *)((long)&p_Var10[1]._M_left + 4);
      severity = *(GLenum *)((long)&p_Var10[1]._M_parent + 4);
      local_218 = (ResultCollector *)CONCAT44(local_218._4_4_,*(undefined4 *)&p_Var10[1]._M_left);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_260,0x1b3c1e9);
      local_1d8._0_4_ = *(undefined4 *)&p_Var10[1]._M_parent;
      local_1e0 = (undefined1  [8])
                  (((BaseCase *)(p_Var10 + 1))->super_ErrorCase).super_TestCase.super_TestCase.
                  super_TestNode._vptr_TestNode;
      local_20c = uVar3;
      local_1e8 = p_Var10;
      local_1d8._4_4_ = uVar3;
      local_1d0._M_allocated_capacity = (size_type)local_1c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1d8 + 8),local_260._0_8_,
                 (code *)(local_260._0_8_ + CONCAT44(local_260._12_4_,local_260._8_4_)));
      lVar11 = *(long *)siglen;
      if (*(long *)(siglen + 8) == lVar11) {
        bVar2 = 1;
      }
      else {
        bVar2 = 1;
        lVar13 = 0;
        uVar12 = 0;
        do {
          puVar5 = *(uint **)(lVar11 + 0x10 + lVar13);
          puVar6 = *(uint **)(lVar11 + 0x18 + lVar13);
          iVar4 = *(int *)(lVar11 + lVar13);
          if (puVar5 == puVar6) {
            if ((((iVar4 == 0x1100) || (iVar4 == local_1e0._0_4_)) &&
                ((iVar4 = *(int *)(lVar11 + 4 + lVar13), iVar4 == 0x1100 ||
                 (iVar4 == local_1e0._4_4_)))) &&
               ((uVar3 = *(uint *)(lVar11 + 8 + lVar13), uVar3 == 0x1100 ||
                (uVar3 == local_1d8._4_4_)))) goto LAB_013d7262;
          }
          else if ((iVar4 == local_1e0._0_4_) &&
                  ((*(int *)(lVar11 + 4 + lVar13) == local_1e0._4_4_ &&
                   (_Var9 = std::
                            __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                      (puVar5,puVar6,local_1d8), _Var9._M_current != puVar6)))) {
LAB_013d7262:
            bVar2 = *(byte *)(lVar11 + 0x28 + lVar13);
          }
          uVar12 = uVar12 + 1;
          lVar11 = *(long *)siglen;
          lVar13 = lVar13 + 0x30;
        } while (uVar12 < (ulong)((*(long *)(siglen + 8) - lVar11 >> 4) * -0x5555555555555555));
      }
      p_Var7 = local_1e8;
      if ((_Alloc_hider *)local_1d0._M_allocated_capacity != local_1c0) {
        operator_delete((void *)local_1d0._M_allocated_capacity,(ulong)(local_1c0[0]._M_p + 1));
      }
      if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
        operator_delete((void *)local_260._0_8_,local_250._0_8_ + 1);
      }
      BaseCase::verifyMessageCount
                ((VerificationResult *)local_260,(BaseCase *)(p_Var10 + 1),
                 (MessageID *)(ulong)local_20c,severity,(int)local_218,bVar2 & 1,
                 (bool)in_stack_fffffffffffffd78);
      local_1e0 = (undefined1  [8])this_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,local_238._M_p,local_230);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      __x = (undefined1  [8])(local_260._0_8_ & 0xffffffff);
      if (local_260._0_4_ != QP_TEST_RESULT_PASS) {
        tcu::ResultCollector::addResult
                  (&(this->super_BaseCase).m_results,local_260._0_4_,(string *)(local_260 + 8));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_p != &local_228) {
        __x = (undefined1  [8])(local_228._M_allocated_capacity + 1);
        operator_delete(local_238._M_p,(ulong)__x);
      }
      if ((undefined1 *)CONCAT44(local_260._12_4_,local_260._8_4_) != local_250 + 8) {
        __x = (undefined1  [8])(local_250._8_8_ + 1);
        operator_delete((undefined1 *)CONCAT44(local_260._12_4_,local_260._8_4_),(ulong)__x);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var10 != &local_60._M_t._M_impl.super__Rb_tree_header);
  }
  tcu::TestLog::endSection((TestLog *)this_00);
  std::
  _Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
  ::_M_erase((_Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageMeta>_>_>
              *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Link_type)__x);
  return extraout_EAX;
}

Assistant:

void FilterCase::verify (const vector<MessageData>& refMessages, const vector<MessageData>& resMessages, const vector<MessageFilter>& filters)
{
	TestLog&						log		= m_testCtx.getLog();
	map<MessageID, MessageMeta>		counts;

	log << TestLog::Section("verification", "Verifying");

	// Gather message counts & severities, report severity mismatches if found
	for (size_t refNdx = 0; refNdx < refMessages.size(); refNdx++)
	{
		const MessageData&	msg  = refMessages[refNdx];
		MessageMeta&		meta = counts[msg.id];

		if (meta.severity != GL_NONE && meta.severity != msg.severity)
		{
			log << TestLog::Message << "A message has variable severity between instances: (" << msg.id << ") with severity "
				<< glu::getDebugMessageSeverityStr(meta.severity) << " and " << glu::getDebugMessageSeverityStr(msg.severity) << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_FAIL, "Message severity changed between instances of the same message");
		}

		meta.refCount++;
		meta.severity = msg.severity;
	}

	for (size_t resNdx = 0; resNdx < resMessages.size(); resNdx++)
	{
		const MessageData&	msg  = resMessages[resNdx];
		MessageMeta&		meta = counts[msg.id];

		if (meta.severity != GL_NONE && meta.severity != msg.severity)
		{
			log << TestLog::Message << "A message has variable severity between instances: (" << msg.id << ") with severity "
				<< glu::getDebugMessageSeverityStr(meta.severity) << " and " << glu::getDebugMessageSeverityStr(msg.severity) << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_FAIL, "Message severity changed between instances of the same message");
		}

		meta.resCount++;
		meta.severity = msg.severity;
	}

	for (map<MessageID, MessageMeta>::const_iterator itr = counts.begin(); itr != counts.end(); itr++)
	{
		const MessageID&	id			= itr->first;
		const GLenum		severity	= itr->second.severity;

		const int			refCount	= itr->second.refCount;
		const int			resCount	= itr->second.resCount;
		const bool			enabled		= isEnabled(filters, MessageData(id, severity, ""));

		VerificationResult	result		= verifyMessageCount(id, severity, refCount, resCount, enabled);

		log << TestLog::Message << result.logMessage << TestLog::EndMessage;

		if (result.result != QP_TEST_RESULT_PASS)
			m_results.addResult(result.result, result.resultMessage);
	}

	log << TestLog::EndSection;
}